

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Q3BSPFileImporter.cpp
# Opt level: O1

void __thiscall
Assimp::Q3BSPFileImporter::CreateDataFromImport
          (Q3BSPFileImporter *this,Q3BSPModel *pModel,aiScene *pScene,ZipArchiveIOSystem *pArchive)

{
  size_t __n;
  aiNode *this_00;
  
  if (pScene == (aiScene *)0x0 || pModel == (Q3BSPModel *)0x0) {
    return;
  }
  this_00 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(this_00);
  pScene->mRootNode = this_00;
  __n = (pModel->m_ModelName)._M_string_length;
  if (0xfffffffffffffc00 < __n - 0x400) {
    (this_00->mName).length = (ai_uint32)__n;
    memcpy((this_00->mName).data,(pModel->m_ModelName)._M_dataplus._M_p,__n);
    (this_00->mName).data[__n] = '\0';
  }
  createMaterialMap(this,pModel);
  CreateNodes(this,pModel,pScene,pScene->mRootNode);
  createMaterials(this,pModel,pScene,pArchive);
  return;
}

Assistant:

void Q3BSPFileImporter::CreateDataFromImport( const Q3BSP::Q3BSPModel *pModel, aiScene* pScene,
    ZipArchiveIOSystem *pArchive ) {
    if (nullptr == pModel || nullptr == pScene) {
        return;
    }

    pScene->mRootNode = new aiNode;
    if ( !pModel->m_ModelName.empty() ) {
        pScene->mRootNode->mName.Set( pModel->m_ModelName );
    }

    // Create the face to material relation map
    createMaterialMap( pModel );

    // Create all nodes
    CreateNodes( pModel, pScene, pScene->mRootNode );

    // Create the assigned materials
    createMaterials( pModel, pScene, pArchive );
}